

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O1

void __thiscall ll_grammar::GrammarLeft::adjust_follow(GrammarLeft *this,int index)

{
  int *__src;
  pointer *ppiVar1;
  int iVar2;
  pointer pvVar3;
  int *piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __dest;
  ulong uVar5;
  long lVar6;
  vector<int,_std::allocator<int>_> tempFollow;
  vector<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             (this->follow).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (this->not_finally_char_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[index]);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      if ((this->elements).
          super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl.
          super__Vector_impl_data._M_start
          [*(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar6)].super_Elem.is_finally == false)
      {
        pvVar3 = (this->follow).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar2 = (this->not_finally_char_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                .super__Vector_impl_data._M_start[index];
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            *(pointer *)
                             ((long)&pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data + 8),
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar6);
        pvVar3 = (this->follow).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar2 = (this->not_finally_char_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                .super__Vector_impl_data._M_start[index];
        __src = __dest._M_current + 1;
        piVar4 = *(pointer *)
                  ((long)&pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (__src != piVar4) {
          memmove(__dest._M_current,__src,(long)piVar4 - (long)__src);
        }
        ppiVar1 = (pointer *)
                  ((long)&pvVar3[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        *ppiVar1 = *ppiVar1 + -1;
        if ((this->not_finally_char_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[index] !=
            *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar6)) {
          adjust_follow(this,*(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar6));
          pvVar3 = (this->follow).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          public_tool::connect_vector
                    (pvVar3 + (this->not_finally_char_index).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[index],
                     pvVar3 + *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start + lVar6));
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 4;
    } while (uVar5 < (ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GrammarLeft::adjust_follow(int index){
    //保存使用
    vector<int> tempFollow = follow[not_finally_char_index[index]];
    for (int i = 0; i < tempFollow.size(); i++){
        if (!elements[tempFollow[i]].is_finally){
            //在原来的Follow中将这个非终结符删除
            vector<int>::const_iterator deleteIt = find(follow[not_finally_char_index[index]].begin(), follow[not_finally_char_index[index]].end(), tempFollow[i]);
            follow[not_finally_char_index[index]].erase(deleteIt);

            //如果两个是一样的
            if (not_finally_char_index[index] != tempFollow[i]) {
                adjust_follow(tempFollow[i]);
                connect_vector(follow[not_finally_char_index[index]], follow[tempFollow[i]]);

            }




        }

    }

}